

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

int __thiscall despot::TabularCPT::ComputeIndex(TabularCPT *this,int pid,double *sum)

{
  double dVar1;
  pointer pvVar2;
  pointer ppVar3;
  pointer pvVar4;
  pointer pdVar5;
  int cur;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  
  pvVar2 = (this->sparse_values_).
           super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->sparse_values_).
      super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pvVar2) {
    pvVar4 = (this->super_CPT).super_Function.values_.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = *(long *)&pvVar4[pid].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    pdVar5 = *(pointer *)
              ((long)&pvVar4[pid].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + 8);
    dVar10 = *sum;
    uVar6 = 0;
    while( true ) {
      if ((long)pdVar5 - lVar8 >> 3 == uVar6) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/parser/function.cpp"
                      ,0x16d,"virtual int despot::TabularCPT::ComputeIndex(int, double &) const");
      }
      dVar1 = *(double *)(lVar8 + uVar6 * 8);
      if (dVar10 < dVar1) break;
      dVar10 = dVar10 - dVar1;
      *sum = dVar10;
      uVar6 = uVar6 + 1;
    }
    *sum = dVar10 / (dVar1 * 1.000000001);
  }
  else {
    ppVar3 = pvVar2[pid].
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)pvVar2[pid].
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 4;
    dVar10 = *sum;
    pdVar7 = &ppVar3->second;
    uVar6 = 0xffffffffffffffff;
    while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
      dVar1 = *pdVar7;
      if (dVar10 < dVar1) {
        *sum = dVar10 / (dVar1 * 1.000000001);
        uVar6 = (ulong)(uint)((pair<int,_double> *)(pdVar7 + -1))->first;
        break;
      }
      dVar10 = dVar10 - dVar1;
      *sum = dVar10;
      pdVar7 = pdVar7 + 2;
    }
  }
  return (int)uVar6;
}

Assistant:

int TabularCPT::ComputeIndex(int pid, double& sum) const {
	if (sparse_values_.size() != 0) {
		for (int i = 0; i < sparse_values_[pid].size(); i++) {
			const pair<int, double>& pair = sparse_values_[pid][i];
			if (sum < pair.second) {
				sum /= pair.second * (1 + 1E-9);
				return pair.first;
			}
			sum -= pair.second;
		}
		return -1;
	} else {
		for (int cur = 0; cur < values_[pid].size(); cur++) {
			if (sum < values_[pid][cur]) {
				sum /= values_[pid][cur] * (1 + 1E-9);
				return cur;
			}
			sum -= values_[pid][cur];
		}
	}

	assert(false);
	return -1;
}